

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O0

void __thiscall
cmDependsC::cmDependsC
          (cmDependsC *this,cmLocalGenerator *lg,char *targetDir,string *lang,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  char *pcVar1;
  char *cr;
  undefined1 local_e8 [8];
  string complainRegexVar;
  char *sr;
  undefined1 local_b8 [8];
  string scanRegexVar;
  string local_90 [8];
  string complainRegex;
  string local_68 [8];
  string scanRegex;
  cmMakefile *mf;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *validDeps_local;
  string *lang_local;
  char *targetDir_local;
  cmLocalGenerator *lg_local;
  cmDependsC *this_local;
  
  cmDepends::cmDepends(&this->super_cmDepends,lg,targetDir);
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsC_00b1f8f8;
  cmsys::RegularExpression::RegularExpression(&this->IncludeRegexLine);
  cmsys::RegularExpression::RegularExpression(&this->IncludeRegexScan);
  cmsys::RegularExpression::RegularExpression(&this->IncludeRegexComplain);
  std::__cxx11::string::string((string *)&this->IncludeRegexLineString);
  std::__cxx11::string::string((string *)&this->IncludeRegexScanString);
  std::__cxx11::string::string((string *)&this->IncludeRegexComplainString);
  std::__cxx11::string::string((string *)&this->IncludeRegexTransformString);
  cmsys::RegularExpression::RegularExpression(&this->IncludeRegexTransform);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->TransformRules);
  this->ValidDeps = validDeps;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Encountered);
  std::
  queue<cmDependsC::UnscannedEntry,std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>>
  ::queue<std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>,void>
            ((queue<cmDependsC::UnscannedEntry,std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>>
              *)&this->Unscanned);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
  ::map(&this->FileCache);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->HeaderLocationCache);
  std::__cxx11::string::string((string *)&this->CacheFileName);
  scanRegex.field_2._8_8_ = cmLocalGenerator::GetMakefile(lg);
  cmDepends::SetIncludePathFromLanguage(&this->super_cmDepends,lang);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"^.*$",(allocator *)(complainRegex.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(complainRegex.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"^$",(allocator *)(scanRegexVar.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(scanRegexVar.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b8,"CMAKE_",(allocator *)((long)&sr + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&sr + 7));
  std::__cxx11::string::operator+=((string *)local_b8,(string *)lang);
  std::__cxx11::string::operator+=((string *)local_b8,"_INCLUDE_REGEX_SCAN");
  complainRegexVar.field_2._8_8_ =
       (size_type)cmMakefile::GetDefinition(scanRegex.field_2._8_8_,(string *)local_b8);
  if ((char *)complainRegexVar.field_2._8_8_ != (char *)0x0) {
    std::__cxx11::string::operator=(local_68,(char *)complainRegexVar.field_2._8_8_);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_e8,"CMAKE_",(allocator *)((long)&cr + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&cr + 7));
  std::__cxx11::string::operator+=((string *)local_e8,(string *)lang);
  std::__cxx11::string::operator+=((string *)local_e8,"_INCLUDE_REGEX_COMPLAIN");
  pcVar1 = cmMakefile::GetDefinition((cmMakefile *)scanRegex.field_2._8_8_,(string *)local_e8);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator=(local_90,pcVar1);
  }
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_b8);
  cmsys::RegularExpression::compile
            (&this->IncludeRegexLine,"^[ \t]*#[ \t]*(include|import)[ \t]*[<\"]([^\">]+)([\">])");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  cmsys::RegularExpression::compile(&this->IncludeRegexScan,pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  cmsys::RegularExpression::compile(&this->IncludeRegexComplain,pcVar1);
  std::__cxx11::string::operator=
            ((string *)&this->IncludeRegexLineString,
             "#IncludeRegexLine: ^[ \t]*#[ \t]*(include|import)[ \t]*[<\"]([^\">]+)([\">])");
  std::__cxx11::string::operator=((string *)&this->IncludeRegexScanString,"#IncludeRegexScan: ");
  std::__cxx11::string::operator+=((string *)&this->IncludeRegexScanString,local_68);
  std::__cxx11::string::operator=
            ((string *)&this->IncludeRegexComplainString,"#IncludeRegexComplain: ");
  std::__cxx11::string::operator+=((string *)&this->IncludeRegexComplainString,local_90);
  SetupTransforms(this);
  std::__cxx11::string::operator=
            ((string *)&this->CacheFileName,(string *)&(this->super_cmDepends).TargetDirectory);
  std::__cxx11::string::operator+=((string *)&this->CacheFileName,"/");
  std::__cxx11::string::operator+=((string *)&this->CacheFileName,(string *)lang);
  std::__cxx11::string::operator+=((string *)&this->CacheFileName,".includecache");
  ReadCacheFile(this);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

cmDependsC::cmDependsC(cmLocalGenerator* lg,
                   const char* targetDir,
                   const std::string& lang,
                   const std::map<std::string, DependencyVector>* validDeps)
: cmDepends(lg, targetDir)
, ValidDeps(validDeps)
{
  cmMakefile* mf = lg->GetMakefile();

  // Configure the include file search path.
  this->SetIncludePathFromLanguage(lang);

  // Configure regular expressions.
  std::string scanRegex = "^.*$";
  std::string complainRegex = "^$";
  {
  std::string scanRegexVar = "CMAKE_";
  scanRegexVar += lang;
  scanRegexVar += "_INCLUDE_REGEX_SCAN";
  if(const char* sr = mf->GetDefinition(scanRegexVar))
    {
    scanRegex = sr;
    }
  std::string complainRegexVar = "CMAKE_";
  complainRegexVar += lang;
  complainRegexVar += "_INCLUDE_REGEX_COMPLAIN";
  if(const char* cr = mf->GetDefinition(complainRegexVar))
    {
    complainRegex = cr;
    }
  }

  this->IncludeRegexLine.compile(INCLUDE_REGEX_LINE);
  this->IncludeRegexScan.compile(scanRegex.c_str());
  this->IncludeRegexComplain.compile(complainRegex.c_str());
  this->IncludeRegexLineString = INCLUDE_REGEX_LINE_MARKER INCLUDE_REGEX_LINE;
  this->IncludeRegexScanString = INCLUDE_REGEX_SCAN_MARKER;
  this->IncludeRegexScanString += scanRegex;
  this->IncludeRegexComplainString = INCLUDE_REGEX_COMPLAIN_MARKER;
  this->IncludeRegexComplainString += complainRegex;

  this->SetupTransforms();

  this->CacheFileName = this->TargetDirectory;
  this->CacheFileName += "/";
  this->CacheFileName += lang;
  this->CacheFileName += ".includecache";

  this->ReadCacheFile();
}